

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O2

void __thiscall
Imf_2_5::TypedDeepImageChannel<unsigned_int>::moveSamplesToNewBuffer
          (TypedDeepImageChannel<unsigned_int> *this,uint *oldNumSamples,uint *newNumSamples,
          size_t *newSampleListPositions)

{
  uint *puVar1;
  size_t sVar2;
  uint **ppuVar3;
  SampleCountChannel *pSVar4;
  uint *puVar5;
  uint *puVar6;
  size_t i;
  size_t sVar7;
  ulong uVar8;
  uint j_1;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  
  puVar1 = this->_sampleBuffer;
  pSVar4 = DeepImageChannel::sampleCounts(&this->super_DeepImageChannel);
  puVar5 = (uint *)operator_new__(-(ulong)(pSVar4->_sampleBufferSize >> 0x3e != 0) |
                                  pSVar4->_sampleBufferSize << 2);
  this->_sampleBuffer = puVar5;
  sVar2 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  for (sVar7 = 0; sVar7 != sVar2; sVar7 = sVar7 + 1) {
    ppuVar3 = this->_sampleListPointers;
    puVar6 = this->_sampleBuffer + newSampleListPositions[sVar7];
    puVar5 = ppuVar3[sVar7];
    uVar9 = oldNumSamples[sVar7];
    uVar11 = newNumSamples[sVar7];
    uVar8 = 0;
    if (uVar11 < uVar9) {
      for (; uVar8 < uVar11; uVar8 = uVar8 + 1) {
        puVar6[uVar8] = puVar5[uVar8];
        uVar11 = newNumSamples[sVar7];
      }
    }
    else {
      for (; uVar10 = (ulong)uVar9, uVar8 < uVar10; uVar8 = uVar8 + 1) {
        puVar6[uVar8] = puVar5[uVar8];
        uVar9 = oldNumSamples[sVar7];
      }
      for (; uVar10 < newNumSamples[sVar7]; uVar10 = uVar10 + 1) {
        puVar6[uVar10] = 0;
      }
    }
    ppuVar3[sVar7] = puVar6;
  }
  if (puVar1 == (uint *)0x0) {
    return;
  }
  operator_delete__(puVar1);
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::moveSamplesToNewBuffer
    (const unsigned int * oldNumSamples,
     const unsigned int * newNumSamples,
     const size_t * newSampleListPositions)
{
    //
    // Allocate a new sample buffer for this channel.
    // Copy the sample lists for all pixels into the new buffer.
    // Then delete the old sample buffer.
    //
    // oldNumSamples            Number of samples in each sample list in the
    //                          old sample buffer.
    //
    // newNumSamples            Number of samples in each sample list in
    //                          the new sample buffer.  If the new number
    //                          of samples is larger than the old number of
    //                          samples for a given sample list, then the
    //                          end of the new sample list is filled with
    //                          zeroes.  If the new number of samples is
    //                          smaller than the old one, then samples at
    //                          the end of the old sample list are discarded.
    //
    // newSampleListPositions   The positions of the new sample lists in the
    //                          new sample buffer.
    //

    T * oldSampleBuffer = _sampleBuffer;
    _sampleBuffer = new T [sampleCounts().sampleBufferSize()];

    for (size_t i = 0; i < numPixels(); ++i)
    {
        T * oldSampleList = _sampleListPointers[i];
        T * newSampleList = _sampleBuffer + newSampleListPositions[i];

        if (oldNumSamples[i] > newNumSamples[i])
        {
            for (unsigned int j = 0; j < newNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];
        }
        else
        {
            for (unsigned int j = 0; j < oldNumSamples[i]; ++j)
                newSampleList[j] = oldSampleList[j];

            for (unsigned int j = oldNumSamples[i]; j < newNumSamples[i]; ++j)
                newSampleList[j] = 0;
        }

        _sampleListPointers[i] = newSampleList;
    }

    delete [] oldSampleBuffer;
}